

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O3

void __thiscall
Js::WebAssemblyEnvironment::SetWasmFunction
          (WebAssemblyEnvironment *this,uint32 index,WasmScriptFunction *func)

{
  Type *ptr;
  Type TVar1;
  uint32 maxCount;
  
  TVar1 = WebAssemblyModule::GetFunctionIndexType((this->module).ptr,index);
  if (TVar1 != Function) {
    TVar1 = WebAssemblyModule::GetFunctionIndexType((this->module).ptr,index);
    if (TVar1 != ImportThunk) {
      Throw::InternalError();
    }
  }
  ptr = (this->functions).ptr;
  maxCount = WebAssemblyModule::GetWasmFunctionCount((this->module).ptr);
  SetVarElement<Js::WasmScriptFunction>(this,ptr,func,index,maxCount);
  return;
}

Assistant:

void WebAssemblyEnvironment::SetWasmFunction(uint32 index, WasmScriptFunction* func)
{
    if (!(module->GetFunctionIndexType(index) == Wasm::FunctionIndexTypes::Function ||
          module->GetFunctionIndexType(index) == Wasm::FunctionIndexTypes::ImportThunk))
    {
        Js::Throw::InternalError();
    }
    SetVarElement<WasmScriptFunction>(functions, func, index, module->GetWasmFunctionCount());
}